

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetColumnWidthAuto(ImGuiTable *table,ImGuiTableColumn *column)

{
  float fVar1;
  float local_24;
  float width_auto;
  float content_width_headers;
  float content_width_body;
  ImGuiTableColumn *column_local;
  ImGuiTable *table_local;
  
  local_24 = ImMax<float>(column->ContentMaxXFrozen,column->ContentMaxXUnfrozen);
  local_24 = local_24 - column->WorkMinX;
  if ((column->Flags & 0x2000U) == 0) {
    local_24 = ImMax<float>(local_24,column->ContentMaxXHeadersIdeal - column->WorkMinX);
  }
  if ((((column->Flags & 0x10U) != 0) && (0.0 < column->InitStretchWeightOrWidth)) &&
     (((table->Flags & 1U) == 0 || ((column->Flags & 0x20U) != 0)))) {
    local_24 = column->InitStretchWeightOrWidth;
  }
  fVar1 = ImMax<float>(local_24,table->MinColumnWidth);
  return fVar1;
}

Assistant:

float ImGui::TableGetColumnWidthAuto(ImGuiTable* table, ImGuiTableColumn* column)
{
    const float content_width_body = ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
    const float content_width_headers = column->ContentMaxXHeadersIdeal - column->WorkMinX;
    float width_auto = content_width_body;
    if (!(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
        width_auto = ImMax(width_auto, content_width_headers);

    // Non-resizable fixed columns preserve their requested width
    if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
        if (!(table->Flags & ImGuiTableFlags_Resizable) || (column->Flags & ImGuiTableColumnFlags_NoResize))
            width_auto = column->InitStretchWeightOrWidth;

    return ImMax(width_auto, table->MinColumnWidth);
}